

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::setCPUThreadCount
          (BeagleCPUImpl<double,_1,_0> *this,int threadCount)

{
  int iVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  int *piVar8;
  double *pdVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 in_ZMM6 [64];
  
  if (threadCount < 1) {
    iVar11 = -5;
  }
  else {
    this->kThreadingEnabled = false;
    this->kAutoPartitioningEnabled = false;
    iVar12 = 0;
    iVar11 = 0;
    if ((this->kFlags & 0x40000000) != 0) {
      iVar5 = std::thread::hardware_concurrency();
      iVar1 = this->kPatternCount;
      uVar6 = 2;
      if (this->kStateCount < 5) {
        uVar6 = (uint)(iVar5 < 0x10) << 9 | 0x100;
      }
      this->kMinPatternCount = uVar6;
      iVar11 = iVar12;
      if ((2 < iVar5) && ((int)uVar6 <= iVar1)) {
        uVar6 = iVar1 / (int)(uVar6 >> 1);
        if ((int)uVar6 < threadCount) {
          threadCount = uVar6;
        }
        pvVar7 = malloc((long)iVar1 * 4);
        iVar12 = iVar1 / threadCount;
        if (0 < iVar1) {
          auVar14 = vpbroadcastq_avx512f();
          auVar15 = vpbroadcastd_avx512f();
          auVar16 = vpbroadcastd_avx512f();
          auVar17 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          uVar13 = 0;
          auVar19 = vpbroadcastq_avx512f(ZEXT816(0x10));
          do {
            uVar4 = vpcmpuq_avx512f(auVar18,auVar14,2);
            iVar5 = (int)uVar13;
            if ((uVar4 & 1) != 0) {
              in_ZMM6 = ZEXT464((uint)((long)((ulong)(uint)(iVar5 >> 0x1f) << 0x20 |
                                             uVar13 & 0xffffffff) / (long)iVar12));
            }
            if ((uVar4 & 2) != 0) {
              auVar3 = vpinsrd_avx(in_ZMM6._0_16_,(iVar5 + 1) / iVar12,1);
              in_ZMM6 = vinserti32x4_avx512f(in_ZMM6,auVar3,0);
            }
            if ((uVar4 & 4) != 0) {
              auVar3 = vpinsrd_avx(in_ZMM6._0_16_,(iVar5 + 2) / iVar12,2);
              in_ZMM6 = vinserti32x4_avx512f(in_ZMM6,auVar3,0);
            }
            if ((uVar4 & 8) != 0) {
              auVar3 = vpinsrd_avx(in_ZMM6._0_16_,(iVar5 + 3) / iVar12,3);
              in_ZMM6 = vinserti32x4_avx512f(in_ZMM6,auVar3,0);
            }
            auVar22 = in_ZMM6;
            if ((uVar4 & 0x10) != 0) {
              auVar20 = vpbroadcastd_avx512f();
              auVar22._0_16_ = in_ZMM6._0_16_;
              auVar22._16_4_ = auVar20._16_4_;
              auVar22._20_4_ = in_ZMM6._20_4_;
              auVar22._24_4_ = in_ZMM6._24_4_;
              auVar22._28_4_ = in_ZMM6._28_4_;
              auVar22._32_4_ = in_ZMM6._32_4_;
              auVar22._36_4_ = in_ZMM6._36_4_;
              auVar22._40_4_ = in_ZMM6._40_4_;
              auVar22._44_4_ = in_ZMM6._44_4_;
              auVar22._48_4_ = in_ZMM6._48_4_;
              auVar22._52_4_ = in_ZMM6._52_4_;
              auVar22._56_4_ = in_ZMM6._56_4_;
              auVar22._60_4_ = in_ZMM6._60_4_;
            }
            auVar20 = auVar22;
            if ((uVar4 & 0x20) != 0) {
              auVar21 = vpbroadcastd_avx512f();
              auVar20._0_20_ = auVar22._0_20_;
              auVar20._20_4_ = auVar21._20_4_;
              auVar20._24_4_ = auVar22._24_4_;
              auVar20._28_4_ = auVar22._28_4_;
              auVar20._32_4_ = auVar22._32_4_;
              auVar20._36_4_ = auVar22._36_4_;
              auVar20._40_4_ = auVar22._40_4_;
              auVar20._44_4_ = auVar22._44_4_;
              auVar20._48_4_ = auVar22._48_4_;
              auVar20._52_4_ = auVar22._52_4_;
              auVar20._56_4_ = auVar22._56_4_;
              auVar20._60_4_ = auVar22._60_4_;
            }
            auVar21 = auVar20;
            if ((uVar4 & 0x40) != 0) {
              auVar22 = vpbroadcastd_avx512f();
              auVar21._0_24_ = auVar20._0_24_;
              auVar21._24_4_ = auVar22._24_4_;
              auVar21._28_4_ = auVar20._28_4_;
              auVar21._32_4_ = auVar20._32_4_;
              auVar21._36_4_ = auVar20._36_4_;
              auVar21._40_4_ = auVar20._40_4_;
              auVar21._44_4_ = auVar20._44_4_;
              auVar21._48_4_ = auVar20._48_4_;
              auVar21._52_4_ = auVar20._52_4_;
              auVar21._56_4_ = auVar20._56_4_;
              auVar21._60_4_ = auVar20._60_4_;
            }
            auVar23 = auVar21;
            if ((uVar4 & 0x80) != 0) {
              auVar22 = vpbroadcastd_avx512f();
              auVar23._0_28_ = auVar21._0_28_;
              auVar23._28_4_ = auVar22._28_4_;
              auVar23._32_4_ = auVar21._32_4_;
              auVar23._36_4_ = auVar21._36_4_;
              auVar23._40_4_ = auVar21._40_4_;
              auVar23._44_4_ = auVar21._44_4_;
              auVar23._48_4_ = auVar21._48_4_;
              auVar23._52_4_ = auVar21._52_4_;
              auVar23._56_4_ = auVar21._56_4_;
              auVar23._60_4_ = auVar21._60_4_;
            }
            uVar4 = vpcmpuq_avx512f(auVar17,auVar14,2);
            auVar24 = auVar23;
            if ((uVar4 & 1) != 0) {
              auVar22 = vpbroadcastd_avx512f();
              auVar24._0_32_ = auVar23._0_32_;
              auVar24._32_4_ = auVar22._32_4_;
              auVar24._36_4_ = auVar23._36_4_;
              auVar24._40_4_ = auVar23._40_4_;
              auVar24._44_4_ = auVar23._44_4_;
              auVar24._48_4_ = auVar23._48_4_;
              auVar24._52_4_ = auVar23._52_4_;
              auVar24._56_4_ = auVar23._56_4_;
              auVar24._60_4_ = auVar23._60_4_;
            }
            auVar25 = auVar24;
            if ((uVar4 & 2) != 0) {
              auVar22 = vpbroadcastd_avx512f();
              auVar25._0_36_ = auVar24._0_36_;
              auVar25._36_4_ = auVar22._36_4_;
              auVar25._40_4_ = auVar24._40_4_;
              auVar25._44_4_ = auVar24._44_4_;
              auVar25._48_4_ = auVar24._48_4_;
              auVar25._52_4_ = auVar24._52_4_;
              auVar25._56_4_ = auVar24._56_4_;
              auVar25._60_4_ = auVar24._60_4_;
            }
            auVar26 = auVar25;
            if ((uVar4 & 4) != 0) {
              auVar22 = vpbroadcastd_avx512f();
              auVar26._0_40_ = auVar25._0_40_;
              auVar26._40_4_ = auVar22._40_4_;
              auVar26._44_4_ = auVar25._44_4_;
              auVar26._48_4_ = auVar25._48_4_;
              auVar26._52_4_ = auVar25._52_4_;
              auVar26._56_4_ = auVar25._56_4_;
              auVar26._60_4_ = auVar25._60_4_;
            }
            auVar27 = auVar26;
            if ((uVar4 & 8) != 0) {
              auVar22 = vpbroadcastd_avx512f();
              auVar27._0_44_ = auVar26._0_44_;
              auVar27._44_4_ = auVar22._44_4_;
              auVar27._48_4_ = auVar26._48_4_;
              auVar27._52_4_ = auVar26._52_4_;
              auVar27._56_4_ = auVar26._56_4_;
              auVar27._60_4_ = auVar26._60_4_;
            }
            auVar28 = auVar27;
            if ((uVar4 & 0x10) != 0) {
              auVar22 = vpbroadcastd_avx512f();
              auVar28._0_48_ = auVar27._0_48_;
              auVar28._48_4_ = auVar22._48_4_;
              auVar28._52_4_ = auVar27._52_4_;
              auVar28._56_4_ = auVar27._56_4_;
              auVar28._60_4_ = auVar27._60_4_;
            }
            auVar29 = auVar28;
            if ((uVar4 & 0x20) != 0) {
              auVar22 = vpbroadcastd_avx512f();
              auVar29._0_52_ = auVar28._0_52_;
              auVar29._52_4_ = auVar22._52_4_;
              auVar29._56_4_ = auVar28._56_4_;
              auVar29._60_4_ = auVar28._60_4_;
            }
            auVar30 = auVar29;
            if ((uVar4 & 0x40) != 0) {
              auVar22 = vpbroadcastd_avx512f();
              auVar30._0_56_ = auVar29._0_56_;
              auVar30._56_4_ = auVar22._56_4_;
              auVar30._60_4_ = auVar29._60_4_;
            }
            auVar31 = auVar30;
            if ((uVar4 & 0x80) != 0) {
              auVar22 = vpbroadcastd_avx512f();
              auVar31._60_4_ = auVar22._60_4_;
              auVar31._0_60_ = auVar30._0_60_;
            }
            uVar4 = vpcmpgtd_avx512f(auVar15,auVar31);
            auVar22 = vpblendmd_avx512f(auVar16,auVar31);
            bVar2 = (bool)((byte)uVar4 & 1);
            in_ZMM6._0_4_ = (uint)bVar2 * auVar22._0_4_ | (uint)!bVar2 * auVar31._0_4_;
            bVar2 = (bool)((byte)(uVar4 >> 1) & 1);
            in_ZMM6._4_4_ = (uint)bVar2 * auVar22._4_4_ | (uint)!bVar2 * auVar31._4_4_;
            bVar2 = (bool)((byte)(uVar4 >> 2) & 1);
            in_ZMM6._8_4_ = (uint)bVar2 * auVar22._8_4_ | (uint)!bVar2 * auVar31._8_4_;
            bVar2 = (bool)((byte)(uVar4 >> 3) & 1);
            in_ZMM6._12_4_ = (uint)bVar2 * auVar22._12_4_ | (uint)!bVar2 * auVar31._12_4_;
            bVar2 = (bool)((byte)(uVar4 >> 4) & 1);
            in_ZMM6._16_4_ = (uint)bVar2 * auVar22._16_4_ | (uint)!bVar2 * auVar31._16_4_;
            bVar2 = (bool)((byte)(uVar4 >> 5) & 1);
            in_ZMM6._20_4_ = (uint)bVar2 * auVar22._20_4_ | (uint)!bVar2 * auVar31._20_4_;
            bVar2 = (bool)((byte)(uVar4 >> 6) & 1);
            in_ZMM6._24_4_ = (uint)bVar2 * auVar22._24_4_ | (uint)!bVar2 * auVar31._24_4_;
            bVar2 = (bool)((byte)(uVar4 >> 7) & 1);
            in_ZMM6._28_4_ = (uint)bVar2 * auVar22._28_4_ | (uint)!bVar2 * auVar31._28_4_;
            bVar2 = (bool)((byte)(uVar4 >> 8) & 1);
            in_ZMM6._32_4_ = (uint)bVar2 * auVar22._32_4_ | (uint)!bVar2 * auVar31._32_4_;
            bVar2 = (bool)((byte)(uVar4 >> 9) & 1);
            in_ZMM6._36_4_ = (uint)bVar2 * auVar22._36_4_ | (uint)!bVar2 * auVar31._36_4_;
            bVar2 = (bool)((byte)(uVar4 >> 10) & 1);
            in_ZMM6._40_4_ = (uint)bVar2 * auVar22._40_4_ | (uint)!bVar2 * auVar31._40_4_;
            bVar2 = (bool)((byte)(uVar4 >> 0xb) & 1);
            in_ZMM6._44_4_ = (uint)bVar2 * auVar22._44_4_ | (uint)!bVar2 * auVar31._44_4_;
            bVar2 = (bool)((byte)(uVar4 >> 0xc) & 1);
            in_ZMM6._48_4_ = (uint)bVar2 * auVar22._48_4_ | (uint)!bVar2 * auVar31._48_4_;
            bVar2 = (bool)((byte)(uVar4 >> 0xd) & 1);
            in_ZMM6._52_4_ = (uint)bVar2 * auVar22._52_4_ | (uint)!bVar2 * auVar31._52_4_;
            bVar2 = (bool)((byte)(uVar4 >> 0xe) & 1);
            in_ZMM6._56_4_ = (uint)bVar2 * auVar22._56_4_ | (uint)!bVar2 * auVar31._56_4_;
            bVar2 = SUB81(uVar4 >> 0xf,0);
            in_ZMM6._60_4_ = (uint)bVar2 * auVar22._60_4_ | (uint)!bVar2 * auVar31._60_4_;
            auVar22 = vmovdqu32_avx512f(in_ZMM6);
            *(undefined1 (*) [64])((long)pvVar7 + uVar13 * 4) = auVar22;
            uVar13 = uVar13 + 0x10;
            auVar18 = vpaddq_avx512f(auVar18,auVar19);
            auVar17 = vpaddq_avx512f(auVar17,auVar19);
          } while ((iVar1 + 0xfU & 0xfffffff0) != uVar13);
        }
        (*(this->super_BeagleImpl)._vptr_BeagleImpl[0xe])(this,(ulong)(uint)threadCount,pvVar7);
        piVar8 = (int *)malloc((long)this->kPartitionCount *
                               (long)*(int *)&(this->super_BeagleImpl).field_0xc * 0x24);
        this->gAutoPartitionOperations = piVar8;
        if (this->kMinPatternCount * 4 <= this->kPatternCount) {
          piVar8 = (int *)malloc((long)threadCount * 4);
          this->gAutoPartitionIndices = piVar8;
          if (0 < (int)uVar6) {
            uVar6 = 1;
            if (1 < threadCount) {
              uVar6 = threadCount;
            }
            auVar14 = vpbroadcastq_avx512f();
            auVar15 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar17 = vpmovsxbd_avx512f(_DAT_00141b90);
            lVar10 = 0;
            auVar18 = vpbroadcastq_avx512f(ZEXT816(0x10));
            auVar19 = vpbroadcastd_avx512f(ZEXT416(0x10));
            do {
              vpcmpuq_avx512f(auVar16,auVar14,2);
              vpcmpuq_avx512f(auVar15,auVar14,2);
              auVar22 = vmovdqu32_avx512f(auVar17);
              *(undefined1 (*) [64])((long)piVar8 + lVar10) = auVar22;
              auVar16 = vpaddq_avx512f(auVar16,auVar18);
              auVar15 = vpaddq_avx512f(auVar15,auVar18);
              auVar17 = vpaddd_avx512f(auVar17,auVar19);
              lVar10 = lVar10 + 0x40;
            } while ((ulong)(uVar6 + 0xf >> 4) << 6 != lVar10);
          }
          pdVar9 = (double *)malloc((long)threadCount << 3);
          this->gAutoPartitionOutSumLogLikelihoods = pdVar9;
          this->kAutoRootPartitioningEnabled = true;
        }
        this->kAutoPartitioningEnabled = true;
      }
    }
  }
  return iVar11;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setCPUThreadCount(int threadCount) {

    if (threadCount < 1)
        return BEAGLE_ERROR_OUT_OF_RANGE;

    kThreadingEnabled = false;
    kAutoPartitioningEnabled = false;
    if (kFlags & BEAGLE_FLAG_THREADING_CPP) {
        int hardwareThreads = std::thread::hardware_concurrency();
        if (kStateCount <= 4) {
            kMinPatternCount = BEAGLE_CPU_ASYNC_MIN_PATTERN_COUNT_LOW;
            if (hardwareThreads < BEAGLE_CPU_ASYNC_HW_THREAD_COUNT_THRESHOLD) {
                kMinPatternCount = BEAGLE_CPU_ASYNC_MIN_PATTERN_COUNT_HIGH;
            }
        } else {
            // todo: assess minimum pattern count for efficient auto-threading
            //       for higher state-count values
            kMinPatternCount = 2;
        }
        if (kPatternCount >= kMinPatternCount && hardwareThreads > 2) {
            int partitionCount = kPatternCount/(kMinPatternCount/2);
            if (partitionCount > threadCount) {
                partitionCount = threadCount;
            }

            int* patternPartitions = (int*) malloc(sizeof(int) * kPatternCount);
            int partitionSize = kPatternCount/partitionCount;
            for (int i=0; i<kPatternCount; i++) {
                int sitePartition = i/partitionSize;
                if (sitePartition > partitionCount - 1)
                    sitePartition = partitionCount - 1;
                patternPartitions[i] = sitePartition;
            }
            setPatternPartitions(partitionCount, patternPartitions);

            gAutoPartitionOperations = (int*) malloc(sizeof(int) * kBufferCount * kPartitionCount * BEAGLE_PARTITION_OP_COUNT);

            if (kPatternCount >= kMinPatternCount*4) {
                gAutoPartitionIndices = (int*) malloc(sizeof(int) * partitionCount);
                for (int i=0; i<partitionCount; i++) {
                    gAutoPartitionIndices[i] = i;
                }
                gAutoPartitionOutSumLogLikelihoods = (double*) malloc(sizeof(double) * partitionCount);
                kAutoRootPartitioningEnabled = true;
            }

            kAutoPartitioningEnabled = true;
        }
    }

    return BEAGLE_SUCCESS;
}